

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AutoincrementBegin(Parse *pParse)

{
  int iVar1;
  sqlite3 *psVar2;
  Vdbe *p;
  char *zP4;
  int addr;
  VdbeOp *pVVar3;
  int iLineno;
  AutoincInfo *pAVar4;
  
  pAVar4 = pParse->pAinc;
  if (pAVar4 != (AutoincInfo *)0x0) {
    psVar2 = pParse->db;
    p = pParse->pVdbe;
    do {
      iVar1 = pAVar4->regCtr;
      sqlite3OpenTable(pParse,0,pAVar4->iDb,(psVar2->aDb[pAVar4->iDb].pSchema)->pSeqTab,0x6c);
      zP4 = pAVar4->pTab->zName;
      addr = sqlite3VdbeAddOp3(p,0x6e,0,iVar1 + -1,0);
      iLineno = 0;
      sqlite3VdbeChangeP4(p,addr,zP4,0);
      pVVar3 = sqlite3VdbeAddOpList(p,0xc,sqlite3AutoincrementBegin::autoInc,iLineno);
      if (pVVar3 == (VdbeOp *)0x0) {
        return;
      }
      pVVar3->p2 = iVar1;
      pVVar3->p3 = iVar1 + 2;
      pVVar3[2].p3 = iVar1;
      pVVar3[3].p1 = iVar1 + -1;
      pVVar3[3].p3 = iVar1;
      pVVar3[3].p5 = 0x10;
      pVVar3[4].p2 = iVar1 + 1;
      pVVar3[5].p3 = iVar1;
      pVVar3[6].p1 = iVar1;
      pVVar3[7].p2 = iVar1 + 2;
      pVVar3[7].p1 = iVar1;
      pVVar3[10].p2 = iVar1;
      if (pParse->nTab == 0) {
        pParse->nTab = 1;
      }
      pAVar4 = pAVar4->pNext;
    } while (pAVar4 != (AutoincInfo *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoincrementBegin(Parse *pParse){
  AutoincInfo *p;            /* Information about an AUTOINCREMENT */
  sqlite3 *db = pParse->db;  /* The database connection */
  Db *pDb;                   /* Database only autoinc table */
  int memId;                 /* Register holding max rowid */
  Vdbe *v = pParse->pVdbe;   /* VDBE under construction */

  /* This routine is never called during trigger-generation.  It is
  ** only called from the top-level */
  assert( pParse->pTriggerTab==0 );
  assert( sqlite3IsToplevel(pParse) );

  assert( v );   /* We failed long ago if this is not so */
  for(p = pParse->pAinc; p; p = p->pNext){
    static const int iLn = VDBE_OFFSET_LINENO(2);
    static const VdbeOpList autoInc[] = {
      /* 0  */ {OP_Null,    0,  0, 0},
      /* 1  */ {OP_Rewind,  0, 10, 0},
      /* 2  */ {OP_Column,  0,  0, 0},
      /* 3  */ {OP_Ne,      0,  9, 0},
      /* 4  */ {OP_Rowid,   0,  0, 0},
      /* 5  */ {OP_Column,  0,  1, 0},
      /* 6  */ {OP_AddImm,  0,  0, 0},
      /* 7  */ {OP_Copy,    0,  0, 0},
      /* 8  */ {OP_Goto,    0, 11, 0},
      /* 9  */ {OP_Next,    0,  2, 0},
      /* 10 */ {OP_Integer, 0,  0, 0},
      /* 11 */ {OP_Close,   0,  0, 0} 
    };
    VdbeOp *aOp;
    pDb = &db->aDb[p->iDb];
    memId = p->regCtr;
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenRead);
    sqlite3VdbeLoadString(v, memId-1, p->pTab->zName);
    aOp = sqlite3VdbeAddOpList(v, ArraySize(autoInc), autoInc, iLn);
    if( aOp==0 ) break;
    aOp[0].p2 = memId;
    aOp[0].p3 = memId+2;
    aOp[2].p3 = memId;
    aOp[3].p1 = memId-1;
    aOp[3].p3 = memId;
    aOp[3].p5 = SQLITE_JUMPIFNULL;
    aOp[4].p2 = memId+1;
    aOp[5].p3 = memId;
    aOp[6].p1 = memId;
    aOp[7].p2 = memId+2;
    aOp[7].p1 = memId;
    aOp[10].p2 = memId;
    if( pParse->nTab==0 ) pParse->nTab = 1;
  }
}